

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
DoInitProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,Var instance)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  uVar1 = playout->inlineCacheIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar3) goto LAB_00a75620;
    *puVar4 = 0;
  }
  if (*(uint *)(this + 200) <= (uint)uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar3) {
LAB_00a75620:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  VarTo<Js::RecyclableObject>(instance);
  FunctionBody::GetPropertyIdFromCacheId
            (*(FunctionBody **)(this + 0x88),(uint)playout->inlineCacheIndex);
  ValidateRegValue(this,*(Var *)(this + (ulong)playout->Value * 8 + 0x160),false,true);
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoInitProperty_NoFastPath(unaligned T* playout, Var instance)
    {
        JavascriptOperators::PatchInitValue<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            VarTo<RecyclableObject>(instance),
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetReg(playout->Value));
    }